

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_neon_widen(TCGContext_conflict1 *tcg_ctx,TCGv_i64 dest,TCGv_i32 src,int size,int u)

{
  int u_local;
  int size_local;
  TCGv_i32 src_local;
  TCGv_i64 dest_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  if (u == 0) {
    if (size == 0) {
      gen_helper_neon_widen_s8(tcg_ctx,dest,src);
    }
    else if (size == 1) {
      gen_helper_neon_widen_s16(tcg_ctx,dest,src);
    }
    else {
      if (size != 2) {
        abort();
      }
      tcg_gen_ext_i32_i64_aarch64(tcg_ctx,dest,src);
    }
  }
  else if (size == 0) {
    gen_helper_neon_widen_u8(tcg_ctx,dest,src);
  }
  else if (size == 1) {
    gen_helper_neon_widen_u16(tcg_ctx,dest,src);
  }
  else {
    if (size != 2) {
      abort();
    }
    tcg_gen_extu_i32_i64_aarch64(tcg_ctx,dest,src);
  }
  tcg_temp_free_i32(tcg_ctx,src);
  return;
}

Assistant:

static inline void gen_neon_widen(TCGContext *tcg_ctx, TCGv_i64 dest, TCGv_i32 src, int size, int u)
{
    if (u) {
        switch (size) {
        case 0: gen_helper_neon_widen_u8(tcg_ctx, dest, src); break;
        case 1: gen_helper_neon_widen_u16(tcg_ctx, dest, src); break;
        case 2: tcg_gen_extu_i32_i64(tcg_ctx, dest, src); break;
        default: abort();
        }
    } else {
        switch (size) {
        case 0: gen_helper_neon_widen_s8(tcg_ctx, dest, src); break;
        case 1: gen_helper_neon_widen_s16(tcg_ctx, dest, src); break;
        case 2: tcg_gen_ext_i32_i64(tcg_ctx, dest, src); break;
        default: abort();
        }
    }
    tcg_temp_free_i32(tcg_ctx, src);
}